

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

bool __thiscall
duckdb::HashJoinGlobalSourceState::TryPrepareNextStage
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  HashJoinSourceStage HVar1;
  bool bVar2;
  pointer pJVar3;
  type this_00;
  
  HVar1 = (this->global_stage)._M_i;
  if (HVar1 == SCAN_HT) {
    if ((this->full_outer_chunk_done).super___atomic_base<unsigned_long>._M_i !=
        (this->full_outer_chunk_count).super___atomic_base<unsigned_long>._M_i) {
      return false;
    }
  }
  else {
    if (HVar1 != PROBE) {
      if ((HVar1 == BUILD) && (this->build_chunk_done == this->build_chunk_count)) {
        pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                 ::operator->(&sink->hash_table);
        this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                  ::operator*(&pJVar3->data_collection);
        TupleDataCollection::VerifyEverythingPinned(this_00);
        pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                 ::operator->(&sink->hash_table);
        pJVar3->finalized = true;
        PrepareProbe(this,sink);
        return true;
      }
      return false;
    }
    if (this->probe_chunk_done != (this->probe_chunk_count).super___atomic_base<unsigned_long>._M_i)
    {
      return false;
    }
    bVar2 = PropagatesBuildSide((this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                super_CachingPhysicalOperator.field_0x81);
    if (bVar2) {
      PrepareScanHT(this,sink);
      return true;
    }
  }
  PrepareBuild(this,sink);
  return true;
}

Assistant:

bool HashJoinGlobalSourceState::TryPrepareNextStage(HashJoinGlobalSinkState &sink) {
	switch (global_stage.load()) {
	case HashJoinSourceStage::BUILD:
		if (build_chunk_done == build_chunk_count) {
			sink.hash_table->GetDataCollection().VerifyEverythingPinned();
			sink.hash_table->finalized = true;
			PrepareProbe(sink);
			return true;
		}
		break;
	case HashJoinSourceStage::PROBE:
		if (probe_chunk_done == probe_chunk_count) {
			if (PropagatesBuildSide(op.join_type)) {
				PrepareScanHT(sink);
			} else {
				PrepareBuild(sink);
			}
			return true;
		}
		break;
	case HashJoinSourceStage::SCAN_HT:
		if (full_outer_chunk_done == full_outer_chunk_count) {
			PrepareBuild(sink);
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}